

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManComputeOverlap2One(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  
  vVisit->nSize = 0;
  if (-1 < iObj) {
    lVar3 = 0;
    do {
      iVar4 = p->vMapping->nSize;
      if (iVar4 <= iObj) break;
      piVar1 = p->vMapping->pArray;
      lVar5 = (long)piVar1[(uint)iObj];
      if ((lVar5 < 0) || (iVar4 <= piVar1[(uint)iObj])) break;
      if (piVar1[lVar5] <= lVar3) {
        iVar2 = Gia_ManComputeOverlap2One_rec(p,iObj,vLabel,vVisit);
        pVVar6 = p->vMapping;
        iVar4 = pVVar6->nSize;
        if (iObj < iVar4) {
          lVar3 = 0;
          goto LAB_0020bc27;
        }
        break;
      }
      iVar4 = piVar1[lVar5 + lVar3 + 1];
      if (((long)iVar4 < 0) || (vLabel->nSize <= iVar4)) goto LAB_0020bcc5;
      lVar3 = lVar3 + 1;
      vLabel->pArray[iVar4] = '\x01';
    } while (-1 < iObj);
  }
  goto LAB_0020bc6e;
LAB_0020bc27:
  do {
    piVar1 = pVVar6->pArray;
    lVar5 = (long)piVar1[(uint)iObj];
    if ((lVar5 < 0) || (iVar4 <= piVar1[(uint)iObj])) break;
    if (piVar1[lVar5] <= lVar3) {
      if (0 < vVisit->nSize) {
        lVar3 = 0;
        do {
          iVar4 = vVisit->pArray[lVar3];
          if (((long)iVar4 < 0) || (vLabel->nSize <= iVar4)) {
LAB_0020bcc5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          vLabel->pArray[iVar4] = '\0';
          lVar3 = lVar3 + 1;
        } while (lVar3 < vVisit->nSize);
      }
      return iVar2;
    }
    iVar4 = piVar1[lVar5 + lVar3 + 1];
    if (((long)iVar4 < 0) || (vLabel->nSize <= iVar4)) goto LAB_0020bcc5;
    vLabel->pArray[iVar4] = '\0';
    lVar3 = lVar3 + 1;
    pVVar6 = p->vMapping;
    iVar4 = pVVar6->nSize;
  } while (iObj < iVar4);
LAB_0020bc6e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManComputeOverlap2One( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    int iFan, k, Counter;
    Vec_IntClear( vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 1 );
    Counter = Gia_ManComputeOverlap2One_rec( p, iObj, vLabel, vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    Vec_IntForEachEntry( vVisit, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    return Counter;
}